

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FatUtils.h
# Opt level: O2

string * trim(string *__return_storage_ptr__,string *s)

{
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  uint *puVar2;
  uint *local_70;
  size_type local_68;
  uint local_60;
  undefined4 uStack_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  _Alloc_hider local_50;
  size_type local_48;
  undefined8 local_40;
  undefined4 uStack_38;
  undefined4 uStack_34;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  uint *local_28;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_20;
  
  std::__cxx11::string::string((string *)&local_70,(string *)s);
  local_20.current._M_current =
       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(local_68 + (long)local_70);
  local_28 = local_70;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<int,int>>>
            (&local_30,&local_20,(unary_negate<std::pointer_to_unary_function<int,_int>_>)&local_28)
  ;
  std::__cxx11::string::erase(&local_70,local_30.current._M_current,(long)local_70 + local_68);
  local_48 = local_68;
  puVar2 = local_70;
  if (local_70 == &local_60) {
    uStack_38 = uStack_58;
    uStack_34 = uStack_54;
    puVar2 = (uint *)&local_40;
  }
  local_40 = CONCAT44(uStack_5c,local_60);
  local_68 = 0;
  local_60 = local_60 & 0xffffff00;
  local_70 = &local_60;
  local_50._M_p = (pointer)puVar2;
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<std::unary_negate<std::pointer_to_unary_function<int,int>>>>
                    (puVar2,local_48 + (long)puVar2,isspace);
  std::__cxx11::string::erase(&local_50,puVar2,_Var1._M_current);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_50._M_p == (pointer)&local_40) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
    *(ulong *)((long)&__return_storage_ptr__->field_2 + 8) = CONCAT44(uStack_34,uStack_38);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_40;
  }
  __return_storage_ptr__->_M_string_length = local_48;
  local_48 = 0;
  local_40 = local_40 & 0xffffffffffffff00;
  local_50._M_p = (pointer)&local_40;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

static inline string trim(string s) {
  return ltrim(rtrim(s));
}